

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

ulong __thiscall
CVmObjStrComp::write_to_stream(CVmObjStrComp *this,CVmStream *str,ulong *bytes_avail)

{
  vmobj_strcmp_ext *pvVar1;
  ulong *in_RDX;
  undefined8 extraout_RDX;
  long *in_RSI;
  CVmObjStrComp *in_RDI;
  wchar_t *vp;
  size_t k;
  size_t j;
  vmobj_strcmp_equiv **ep;
  size_t need_size;
  size_t equiv_cnt;
  size_t total_value_ch;
  vmobj_strcmp_equiv ***p;
  size_t i;
  vmobj_strcmp_ext *ext;
  wchar_t ref_ch_base;
  wchar_t *local_78;
  size_t local_70;
  ulong local_68;
  size_t *in_stack_ffffffffffffffa0;
  vmobj_strcmp_equiv **ppvVar2;
  size_t *in_stack_ffffffffffffffa8;
  CVmObjStrComp *in_stack_ffffffffffffffb0;
  ulong local_48;
  vmobj_strcmp_equiv ***local_40;
  ulong local_38;
  int local_24;
  ulong local_8;
  
  pvVar1 = get_ext(in_RDI);
  count_equiv_mappings
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_8 = (long)in_stack_ffffffffffffffb0 * 0xb + 8 + local_48 * 2;
  if ((in_RDX == (ulong *)0x0) || (local_8 <= *in_RDX)) {
    (**(code **)(*in_RSI + 0x58))(in_RSI,pvVar1->trunc_len & 0xffffffff);
    (**(code **)(*in_RSI + 0x58))(in_RSI,pvVar1->case_sensitive != 0);
    (**(code **)(*in_RSI + 0x58))(in_RSI,(ulong)in_stack_ffffffffffffffb0 & 0xffffffff);
    (**(code **)(*in_RSI + 0x58))(in_RSI,local_48 & 0xffffffff);
    local_24 = 0;
    local_40 = pvVar1->equiv;
    for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
      if (*local_40 != (vmobj_strcmp_equiv **)0x0) {
        local_68 = 0;
        ppvVar2 = *local_40;
        for (; local_68 < 0x100; local_68 = local_68 + 1) {
          if (*ppvVar2 != (vmobj_strcmp_equiv *)0x0) {
            (**(code **)(*in_RSI + 0x58))(in_RSI,local_24 + (int)local_68);
            (**(code **)(*in_RSI + 0x20))
                      (in_RSI,(*ppvVar2)->val_ch_cnt & 0xff,extraout_RDX,
                       (*ppvVar2)->val_ch_cnt & 0xff);
            (**(code **)(*in_RSI + 0x68))(in_RSI,(*ppvVar2)->uc_result_flags);
            (**(code **)(*in_RSI + 0x68))(in_RSI,(*ppvVar2)->lc_result_flags);
            local_78 = (*ppvVar2)->val_ch;
            for (local_70 = (*ppvVar2)->val_ch_cnt; local_70 != 0; local_70 = local_70 - 1) {
              (**(code **)(*in_RSI + 0x58))(in_RSI,*local_78);
              local_78 = local_78 + 1;
            }
          }
          ppvVar2 = ppvVar2 + 1;
        }
      }
      local_40 = local_40 + 1;
      local_24 = local_24 + 0x100;
    }
  }
  return local_8;
}

Assistant:

ulong CVmObjStrComp::write_to_stream(VMG_ CVmStream *str, ulong *bytes_avail)
{
    wchar_t ref_ch_base;
    vmobj_strcmp_ext *ext = get_ext();
    size_t i;
    vmobj_strcmp_equiv ***p;
    size_t total_value_ch;
    size_t equiv_cnt;
    size_t need_size;

    /* get the mapping totals */
    count_equiv_mappings(&equiv_cnt, &total_value_ch);

    /* 
     *   Calculate our space needs.  We need 8 bytes for the fixed header,
     *   11 bytes per equivalent mapping, and 2 bytes per value string
     *   character. 
     */
    need_size = 8 + (11 * equiv_cnt) + (2 * total_value_ch);
    
    /* if we have a size limit, check to make sure we can abide by it */
    if (bytes_avail != 0 && need_size > *bytes_avail)
    {
        /* 
         *   there's not enough space in the output stream for us, so don't
         *   write anything at all; simply return the amount of space we
         *   need 
         */
        return need_size;
    }

    /* write out the serialization structure header */
    str->write_uint2(ext->trunc_len);
    str->write_uint2(ext->case_sensitive ? 0x0001 : 0x0000);
    str->write_uint2(equiv_cnt);
    str->write_uint2(total_value_ch);

    /* run through our equivalence table again and write the mappings */
    for (ref_ch_base = 0, i = 0, p = ext->equiv ; i < countof(ext->equiv) ;
         ++i, ++p, ref_ch_base += 256)
    {
        vmobj_strcmp_equiv **ep;
        size_t j;

        /* if this first-tier mapping is unused, skip it */
        if (*p == 0)
            continue;

        /* run through our second-level table */
        for (j = 0, ep = *p ; j < 256 ; ++j, ++ep)
        {
            /* if this mapping is used, write it out */
            if (*ep != 0)
            {
                size_t k;
                wchar_t *vp;
                
                /* write the fixed part of the mapping */
                str->write_uint2(ref_ch_base + j);
                str->write_byte((uchar)(*ep)->val_ch_cnt);
                str->write_uint4((*ep)->uc_result_flags);
                str->write_uint4((*ep)->lc_result_flags);

                /* write the value mapping characters */
                for (k = (*ep)->val_ch_cnt, vp = (*ep)->val_ch ; k != 0 ;
                     --k, ++vp)
                {
                    /* write this character */
                    str->write_uint2(*vp);
                }
            }
        }
    }

    /* return our space needs */
    return need_size;
}